

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCM_Parser.cpp
# Opt level: O2

h__WAVParser * __thiscall
ASDCP::PCM::WAVParser::h__WAVParser::OpenRead
          (h__WAVParser *this,string *filename,Rational *PictureRate)

{
  AudioDescriptor *pAVar1;
  ui32_t uVar2;
  Rational *in_RCX;
  SimpleAIFFHeader AIFFHeader;
  SimpleRF64Header RF64Header;
  SimpleWaveHeader WavHeader;
  SimpleAIFFHeader local_1b0;
  SimpleRF64Header local_198;
  SimpleWaveHeader local_178;
  SimpleRF64Header local_158 [3];
  Result_t local_f0 [104];
  Result_t local_88 [104];
  
  Kumu::FileReader::OpenRead((string *)this);
  if (-1 < *(int *)this) {
    local_178.data_len = 0;
    local_178.format = 0;
    local_178.nchannels = 0;
    local_178.samplespersec = 0;
    local_178.avgbps = 0;
    local_178.blockalign = 0;
    local_178.bitspersample = 0;
    local_178.cbsize = 0;
    Wav::SimpleWaveHeader::ReadFromFile
              ((SimpleWaveHeader *)local_158,(IFileReader *)&local_178,(ui32_t *)filename);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_158);
    Kumu::Result_t::~Result_t((Result_t *)local_158);
    if (*(int *)this < 0) {
      local_1b0.numChannels = 0;
      local_1b0.numSampleFrames = 0;
      local_1b0.sampleSize = 0;
      local_1b0.sampleRate[0] = '\0';
      local_1b0.sampleRate[1] = '\0';
      local_1b0.sampleRate[2] = '\0';
      local_1b0.sampleRate[3] = '\0';
      local_1b0.sampleRate[4] = '\0';
      local_1b0.sampleRate[5] = '\0';
      local_1b0.sampleRate[6] = '\0';
      local_1b0.sampleRate[7] = '\0';
      local_1b0.sampleRate[8] = '\0';
      local_1b0.sampleRate[9] = '\0';
      local_1b0.data_len = 0;
      Kumu::FileReader::Seek((long)local_88,(SeekPos_t)filename);
      Kumu::Result_t::~Result_t(local_88);
      AIFF::SimpleAIFFHeader::ReadFromFile
                ((SimpleAIFFHeader *)local_158,(IFileReader *)&local_1b0,(ui32_t *)filename);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_158);
      Kumu::Result_t::~Result_t((Result_t *)local_158);
      if (*(int *)this < 0) {
        local_198.data_len = 0;
        local_198.format = 0;
        local_198.nchannels = 0;
        local_198.samplespersec = 0;
        local_198.avgbps = 0;
        local_198.blockalign = 0;
        local_198.bitspersample = 0;
        local_198.cbsize = 0;
        Kumu::FileReader::Seek((long)local_f0,(SeekPos_t)filename);
        Kumu::Result_t::~Result_t(local_f0);
        RF64::SimpleRF64Header::ReadFromFile(local_158,(IFileReader *)&local_198,(ui32_t *)filename)
        ;
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_158);
        Kumu::Result_t::~Result_t((Result_t *)local_158);
        if (-1 < *(int *)this) {
          pAVar1 = (AudioDescriptor *)((long)&filename[2].field_2 + 8);
          RF64::SimpleRF64Header::FillADesc(&local_198,pAVar1,*in_RCX);
          uVar2 = CalcFrameBufferSize(pAVar1);
          *(ui32_t *)&filename[2]._M_string_length = uVar2;
          *(ui64_t *)((long)&filename[1].field_2 + 8) = local_198.data_len;
          *(int *)&filename[4]._M_dataplus._M_p = (int)(local_198.data_len / uVar2);
          *(undefined4 *)((long)&filename[4]._M_dataplus._M_p + 4) = 0;
          Reset((h__WAVParser *)filename);
        }
      }
      else {
        pAVar1 = (AudioDescriptor *)((long)&filename[2].field_2 + 8);
        AIFF::SimpleAIFFHeader::FillADesc(&local_1b0,pAVar1,*in_RCX);
        uVar2 = CalcFrameBufferSize(pAVar1);
        *(ui32_t *)&filename[2]._M_string_length = uVar2;
        *(ulong *)((long)&filename[1].field_2 + 8) = (ulong)local_1b0.data_len;
        *(uint *)&filename[4]._M_dataplus._M_p = local_1b0.data_len / uVar2;
        *(undefined4 *)((long)&filename[4]._M_dataplus._M_p + 4) = 0;
        Reset((h__WAVParser *)filename);
      }
    }
    else {
      pAVar1 = (AudioDescriptor *)((long)&filename[2].field_2 + 8);
      Wav::SimpleWaveHeader::FillADesc(&local_178,pAVar1,*in_RCX);
      uVar2 = CalcFrameBufferSize(pAVar1);
      *(ui32_t *)&filename[2]._M_string_length = uVar2;
      *(ulong *)((long)&filename[1].field_2 + 8) = (ulong)local_178.data_len;
      *(uint *)&filename[4]._M_dataplus._M_p = local_178.data_len / uVar2;
      *(undefined4 *)((long)&filename[4]._M_dataplus._M_p + 4) = 0;
      Reset((h__WAVParser *)filename);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::WAVParser::h__WAVParser::OpenRead(const std::string& filename, const Rational& PictureRate)
{
  Result_t result = m_FileReader.OpenRead(filename);

  if ( ASDCP_SUCCESS(result) )
    {
      SimpleWaveHeader WavHeader;
      result = WavHeader.ReadFromFile(m_FileReader, &m_DataStart);
  
      if ( ASDCP_SUCCESS(result) )
	{
	  WavHeader.FillADesc(m_ADesc, PictureRate);
	  m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
	  m_DataLength = WavHeader.data_len;
	  m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
	  m_ADesc.ChannelFormat = PCM::CF_NONE;
	  Reset();
	}
      else
	{
	  ASDCP::AIFF::SimpleAIFFHeader AIFFHeader;
	  m_FileReader.Seek(0);

      result = AIFFHeader.ReadFromFile(m_FileReader, &m_DataStart);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      AIFFHeader.FillADesc(m_ADesc, PictureRate);
	      m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
	      m_DataLength = AIFFHeader.data_len;
	      m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
	      m_ADesc.ChannelFormat = PCM::CF_NONE;
	      Reset();
	    }
	  else
	    {
	      SimpleRF64Header RF64Header;
	      m_FileReader.Seek(0);
          result = RF64Header.ReadFromFile(m_FileReader, &m_DataStart);

	      if ( ASDCP_SUCCESS(result) )
		{
		  RF64Header.FillADesc(m_ADesc, PictureRate);
		  m_FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(m_ADesc);
		  m_DataLength = RF64Header.data_len;
		  m_ADesc.ContainerDuration = m_DataLength / m_FrameBufferSize;
		  m_ADesc.ChannelFormat = PCM::CF_NONE;
		  Reset();
		}
	    }
	}
    }

  return result;
}